

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O2

void HTS_Engine_initialize(HTS_Engine *engine)

{
  *(undefined8 *)((long)&(engine->condition).fperiod + 1) = 0;
  *(undefined8 *)((long)&(engine->condition).audio_buff_size + 1) = 0;
  (engine->condition).sampling_frequency = 0;
  (engine->condition).fperiod = 0;
  (engine->condition).volume = 1.0;
  (engine->condition).msd_threshold = (double *)0x0;
  (engine->condition).gv_weight = (double *)0x0;
  (engine->condition).speed = 1.0;
  (engine->condition).phoneme_alignment_flag = '\0';
  (engine->condition).stage = 0;
  (engine->condition).use_log_gain = '\0';
  (engine->condition).alpha = 0.0;
  (engine->condition).beta = 0.0;
  (engine->condition).additional_half_tone = 0.0;
  (engine->condition).duration_iw = (double *)0x0;
  (engine->condition).parameter_iw = (double **)0x0;
  (engine->condition).gv_iw = (double **)0x0;
  HTS_Audio_initialize(&engine->audio);
  HTS_ModelSet_initialize(&engine->ms);
  HTS_Label_initialize(&engine->label);
  HTS_SStreamSet_initialize(&engine->sss);
  HTS_PStreamSet_initialize(&engine->pss);
  HTS_GStreamSet_initialize(&engine->gss);
  return;
}

Assistant:

void HTS_Engine_initialize(HTS_Engine * engine)
{
   /* global */
   engine->condition.sampling_frequency = 0;
   engine->condition.fperiod = 0;
   engine->condition.audio_buff_size = 0;
   engine->condition.stop = FALSE;
   engine->condition.volume = 1.0;
   engine->condition.msd_threshold = NULL;
   engine->condition.gv_weight = NULL;

   /* duration */
   engine->condition.speed = 1.0;
   engine->condition.phoneme_alignment_flag = FALSE;

   /* spectrum */
   engine->condition.stage = 0;
   engine->condition.use_log_gain = FALSE;
   engine->condition.alpha = 0.0;
   engine->condition.beta = 0.0;

   /* log F0 */
   engine->condition.additional_half_tone = 0.0;

   /* interpolation weights */
   engine->condition.duration_iw = NULL;
   engine->condition.parameter_iw = NULL;
   engine->condition.gv_iw = NULL;

   /* initialize audio */
   HTS_Audio_initialize(&engine->audio);
   /* initialize model set */
   HTS_ModelSet_initialize(&engine->ms);
   /* initialize label list */
   HTS_Label_initialize(&engine->label);
   /* initialize state sequence set */
   HTS_SStreamSet_initialize(&engine->sss);
   /* initialize pstream set */
   HTS_PStreamSet_initialize(&engine->pss);
   /* initialize gstream set */
   HTS_GStreamSet_initialize(&engine->gss);
}